

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O1

int __thiscall poll(void *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)((long)this + 0x20);
  lVar2 = 0;
  do {
    *(uint *)((long)this + lVar2 * 4) = key_array[*(int *)(lVar1 + lVar2 * 4)] & 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return (int)lVar1;
}

Assistant:

static void poll(VCONTROLLER * this)
{
   int i;

   int *private_data = (int *)(this->private_data);

   for (i = 0; i < 3; i++) {
      if (key_down(private_data[i])) {
         this->button[i] = 1;
      } else {
         this->button[i] = 0;
      }
   }
}